

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int32_t zng_deflateReset(zng_stream *strm)

{
  int iVar1;
  internal_state *piVar2;
  int32_t iVar3;
  code *pcVar4;
  code *pcVar5;
  code *pcVar6;
  bool bVar7;
  
  iVar3 = zng_deflateResetKeep(strm);
  if (iVar3 == 0) {
    piVar2 = strm->state;
    piVar2->window_size = piVar2->w_size * 2;
    memset(piVar2->head,0,0x20000);
    iVar1 = piVar2->level;
    piVar2->max_lazy_match = (uint)configuration_table[iVar1].max_lazy;
    piVar2->good_match = (uint)configuration_table[iVar1].good_length;
    piVar2->nice_match = (uint)configuration_table[iVar1].nice_length;
    bVar7 = 0x400 < configuration_table[iVar1].max_chain;
    piVar2->max_chain_length = (uint)configuration_table[iVar1].max_chain;
    pcVar4 = update_hash;
    if (bVar7) {
      pcVar4 = update_hash_roll;
    }
    pcVar5 = insert_string;
    if (bVar7) {
      pcVar5 = insert_string_roll;
    }
    pcVar6 = quick_insert_string;
    if (bVar7) {
      pcVar6 = quick_insert_string_roll;
    }
    piVar2->update_hash = pcVar4;
    piVar2->insert_string = pcVar5;
    piVar2->quick_insert_string = pcVar6;
    piVar2->lookahead = 0;
    piVar2->insert = 0;
    piVar2->ins_h = 0;
    piVar2->block_start = 0;
    piVar2->match_available = 0;
    piVar2->strstart = 0;
    piVar2->match_start = 0;
    piVar2->prev_length = 0;
  }
  return iVar3;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateReset)(PREFIX3(stream) *strm) {
    int ret = PREFIX(deflateResetKeep)(strm);
    if (ret == Z_OK)
        lm_init(strm->state);
    return ret;
}